

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ColoredLineCase::verifyImage
          (ColoredLineCase *this,ConstPixelBufferAccess *testImageAccess,
          ConstPixelBufferAccess *referenceImageAccess)

{
  ostringstream *poVar1;
  float fVar2;
  TextureFormat log;
  bool bVar3;
  int iVar4;
  RenderTarget *pRVar5;
  ConstPixelBufferAccess *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  ChannelOrder __fd;
  void *data;
  Surface diffMask;
  Surface local_4e8;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  TextureFormat local_3f0;
  string local_3e8;
  LogImageSet local_3c8;
  LogImage local_388;
  undefined1 local_2f8 [120];
  ios_base local_280 [264];
  ConstPixelBufferAccess local_178;
  LogImage local_150;
  LogImage local_c0;
  
  pRVar5 = Context::getRenderTarget
                     ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.m_context
                     );
  log = (TextureFormat)
        ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.
         super_TestNode.m_testCtx)->m_log;
  local_2f8._0_8_ = log;
  if (pRVar5->m_numSamples < 2) {
    tcu::Surface::Surface(&local_4e8,200,200);
    poVar1 = (ostringstream *)(local_2f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Comparing images... ",0x14);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_280);
    poVar1 = (ostringstream *)(local_2f8 + 8);
    local_2f8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Deviation within radius of ",0x1b);
    std::ostream::operator<<(poVar1,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," is allowed.",0xc);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_280);
    poVar1 = (ostringstream *)(local_2f8 + 8);
    local_2f8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::ostream::operator<<(poVar1,6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," faulty pixels are allowed.",0x1b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_280);
    local_388.m_name._M_dataplus._M_p = (pointer)0x300000008;
    data = (void *)local_4e8.m_pixels.m_cap;
    if ((void *)local_4e8.m_pixels.m_cap != (void *)0x0) {
      data = local_4e8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_2f8,(TextureFormat *)&local_388,local_4e8.m_width,
               local_4e8.m_height,1,data);
    iVar4 = compareImages((TestLog *)log,testImageAccess,referenceImageAccess,
                          (PixelBufferAccess *)local_2f8,1,compareColoredPixels);
    if (6 < iVar4) {
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Images","");
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Image comparison","");
      tcu::LogImageSet::LogImageSet(&local_3c8,&local_410,&local_430);
      tcu::TestLog::startImageSet
                ((TestLog *)log,local_3c8.m_name._M_dataplus._M_p,
                 local_3c8.m_description._M_dataplus._M_p);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"TestImage","");
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"Test image","");
      tcu::LogImage::LogImage
                (&local_388,&local_450,&local_470,testImageAccess,QP_IMAGE_COMPRESSION_MODE_BEST);
      __fd = log.order;
      tcu::LogImage::write(&local_388,__fd,__buf,(size_t)testImageAccess);
      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"ReferenceImage","");
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"Reference image","");
      tcu::LogImage::LogImage
                (&local_c0,&local_490,&local_4b0,referenceImageAccess,QP_IMAGE_COMPRESSION_MODE_BEST
                );
      tcu::LogImage::write(&local_c0,__fd,__buf_00,(size_t)referenceImageAccess);
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"DifferenceMask","");
      local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Difference mask","");
      local_3f0.order = RGBA;
      local_3f0.type = UNORM_INT8;
      if ((void *)local_4e8.m_pixels.m_cap != (void *)0x0) {
        local_4e8.m_pixels.m_cap = (size_t)local_4e8.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_178,&local_3f0,local_4e8.m_width,local_4e8.m_height,1,
                 (void *)local_4e8.m_pixels.m_cap);
      access = &local_178;
      tcu::LogImage::LogImage
                (&local_150,&local_4d0,&local_3e8,access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_150,__fd,__buf_01,(size_t)access);
      tcu::TestLog::endImageSet((TestLog *)log);
      poVar1 = (ostringstream *)(local_2f8 + 8);
      local_2f8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Got ",4);
      std::ostream::operator<<(poVar1,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," faulty pixel(s).",0x11)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.m_description._M_dataplus._M_p != &local_150.m_description.field_2) {
        operator_delete(local_150.m_description._M_dataplus._M_p,
                        local_150.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.m_name._M_dataplus._M_p != &local_150.m_name.field_2) {
        operator_delete(local_150.m_name._M_dataplus._M_p,
                        local_150.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_description._M_dataplus._M_p != &local_c0.m_description.field_2) {
        operator_delete(local_c0.m_description._M_dataplus._M_p,
                        local_c0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_name._M_dataplus._M_p != &local_c0.m_name.field_2) {
        operator_delete(local_c0.m_name._M_dataplus._M_p,
                        local_c0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.m_description._M_dataplus._M_p != &local_388.m_description.field_2) {
        operator_delete(local_388.m_description._M_dataplus._M_p,
                        local_388.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.m_name._M_dataplus._M_p != &local_388.m_name.field_2) {
        operator_delete(local_388.m_name._M_dataplus._M_p,
                        local_388.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.m_description._M_dataplus._M_p != &local_3c8.m_description.field_2) {
        operator_delete(local_3c8.m_description._M_dataplus._M_p,
                        local_3c8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.m_name._M_dataplus._M_p != &local_3c8.m_name.field_2) {
        operator_delete(local_3c8.m_name._M_dataplus._M_p,
                        local_3c8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      tcu::TestContext::setTestResult
                ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Got faulty pixels");
    }
    tcu::Surface::~Surface(&local_4e8);
  }
  else {
    bVar3 = tcu::fuzzyCompare((TestLog *)log,"Images",glcts::fixed_sample_locations_values + 1,
                              referenceImageAccess,testImageAccess,0.3,COMPARE_LOG_ON_ERROR);
    if (!bVar3) {
      fVar2 = (this->super_LineRenderTestCase).m_lineWidth;
      if ((fVar2 == 1.0) && (!NAN(fVar2))) {
        tcu::TestContext::setTestResult
                  ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.
                   super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Got faulty pixels");
        return;
      }
      poVar1 = (ostringstream *)(local_2f8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Wide line support is optional, reporting compatibility warning."
                 ,0x3f);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_280);
      tcu::TestContext::setTestResult
                ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_COMPATIBILITY_WARNING,
                 "Wide line clipping failed");
    }
  }
  return;
}

Assistant:

void ColoredLineCase::verifyImage (const tcu::ConstPixelBufferAccess& testImageAccess, const tcu::ConstPixelBufferAccess& referenceImageAccess)
{
	const bool		msaa	= m_context.getRenderTarget().getNumSamples() > 1;
	tcu::TestLog&	log		= m_testCtx.getLog();

	if (!msaa)
	{
		const int	kernelRadius	= 1;
		const int	faultyLimit		= 6;
		int			faultyPixels;

		tcu::Surface diffMask(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

		log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
		log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;
		log << TestLog::Message << faultyLimit << " faulty pixels are allowed." << TestLog::EndMessage;

		faultyPixels = compareColoredImages(log, testImageAccess, referenceImageAccess, diffMask.getAccess(), kernelRadius);

		if (faultyPixels > faultyLimit)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testImageAccess)
				<< TestLog::Image("ReferenceImage", "Reference image", referenceImageAccess)
				<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
	else
	{
		const float threshold = 0.3f;
		if (!tcu::fuzzyCompare(log, "Images", "", referenceImageAccess, testImageAccess, threshold, tcu::COMPARE_LOG_ON_ERROR))
		{
			if (m_lineWidth != 1.0f)
			{
				log << TestLog::Message << "Wide line support is optional, reporting compatibility warning." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Wide line clipping failed");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
}